

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::remove_duplicates
          (xpath_node_set_raw *this,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  xpath_node *it;
  void *__s;
  xpath_node *pxVar3;
  xpath_node *pxVar4;
  xpath_node *pxVar5;
  xml_node_struct *pxVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  xpath_allocator_capture cr;
  xpath_allocator_capture local_40;
  xpath_node_set_raw *pxVar10;
  
  if (this->_type == type_unsorted) {
    pxVar3 = this->_begin;
    pxVar4 = this->_end;
    uVar7 = (long)pxVar4 - (long)pxVar3;
    if (0x20 < (long)uVar7) {
      local_40._state._root = alloc->_root;
      local_40._state._root_size = alloc->_root_size;
      local_40._state._error = alloc->_error;
      uVar11 = 1;
      do {
        uVar12 = uVar11;
        uVar11 = uVar12 * 2;
      } while (uVar12 < (uVar7 >> 5) + (uVar7 >> 4));
      local_40._target = alloc;
      __s = xpath_allocator::allocate(alloc,uVar12 * 8);
      if (__s != (void *)0x0) {
        memset(__s,0,uVar12 * 8);
        pxVar3 = this->_begin;
        pxVar4 = this->_end;
        pxVar5 = pxVar3;
        if (pxVar3 != pxVar4) {
          uVar12 = uVar12 - 1;
          do {
            pxVar6 = (xml_node_struct *)(pxVar3->_attribute)._attr;
            if (pxVar6 == (xml_node_struct *)0x0) {
              pxVar6 = (pxVar3->_node)._root;
            }
            if (pxVar6 != (xml_node_struct *)0x0) {
              uVar8 = ((uint)((ulong)pxVar6 >> 0x10) & 0xffff ^ (uint)pxVar6) * -0x7a143595;
              uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
              uVar7 = (ulong)((uVar8 >> 0x10 ^ uVar8) & (uint)uVar12);
              uVar11 = 0;
              do {
                pxVar1 = *(xml_node_struct **)((long)__s + uVar7 * 8);
                if (pxVar1 == (xml_node_struct *)0x0) {
                  *(xml_node_struct **)((long)__s + uVar7 * 8) = pxVar6;
                  pxVar2 = (pxVar3->_attribute)._attr;
                  (pxVar5->_node)._root = (pxVar3->_node)._root;
                  (pxVar5->_attribute)._attr = pxVar2;
                  pxVar5 = pxVar5 + 1;
                  pxVar4 = this->_end;
                  break;
                }
                if (pxVar1 == pxVar6) break;
                lVar9 = uVar7 + uVar11;
                uVar11 = uVar11 + 1;
                uVar7 = lVar9 + 1U & uVar12;
              } while (uVar11 <= uVar12);
            }
            pxVar3 = pxVar3 + 1;
          } while (pxVar3 != pxVar4);
        }
        this->_end = pxVar5;
      }
      xpath_allocator_capture::~xpath_allocator_capture(&local_40);
      return;
    }
  }
  else {
    pxVar3 = this->_begin;
    pxVar4 = this->_end;
  }
  uVar7 = (long)pxVar4 - (long)pxVar3;
  pxVar10 = this;
  do {
    pxVar5 = pxVar3;
    pxVar3 = pxVar5 + 1;
    if ((long)uVar7 < 0x11) break;
    auVar15._0_4_ = -(uint)(*(int *)&(pxVar3->_node)._root == *(int *)&(pxVar5->_node)._root);
    auVar15._4_4_ =
         -(uint)(*(int *)((long)&pxVar5[1]._node._root + 4) ==
                *(int *)((long)&(pxVar5->_node)._root + 4));
    auVar15._8_4_ =
         -(uint)(*(int *)&pxVar5[1]._attribute._attr == *(int *)&(pxVar5->_attribute)._attr);
    auVar15._12_4_ =
         -(uint)(*(int *)((long)&pxVar5[1]._attribute._attr + 4) ==
                *(int *)((long)&(pxVar5->_attribute)._attr + 4));
    auVar13._4_4_ = auVar15._0_4_;
    auVar13._0_4_ = auVar15._4_4_;
    auVar13._8_4_ = auVar15._12_4_;
    auVar13._12_4_ = auVar15._8_4_;
    uVar8 = movmskpd((int)pxVar10,auVar13 & auVar15);
    pxVar10 = (xpath_node_set_raw *)(ulong)uVar8;
    uVar7 = uVar7 - 0x10;
  } while (uVar8 != 3);
  if (pxVar5 != pxVar4) {
    for (; pxVar3 != pxVar4; pxVar3 = pxVar3 + 1) {
      auVar16._0_4_ = -(uint)(*(int *)&(pxVar5->_node)._root == *(int *)&(pxVar3->_node)._root);
      auVar16._4_4_ =
           -(uint)(*(int *)((long)&(pxVar5->_node)._root + 4) ==
                  *(int *)((long)&(pxVar3->_node)._root + 4));
      auVar16._8_4_ =
           -(uint)(*(int *)&(pxVar5->_attribute)._attr == *(int *)&(pxVar3->_attribute)._attr);
      auVar16._12_4_ =
           -(uint)(*(int *)((long)&(pxVar5->_attribute)._attr + 4) ==
                  *(int *)((long)&(pxVar3->_attribute)._attr + 4));
      auVar14._4_4_ = auVar16._0_4_;
      auVar14._0_4_ = auVar16._4_4_;
      auVar14._8_4_ = auVar16._12_4_;
      auVar14._12_4_ = auVar16._8_4_;
      uVar8 = movmskpd((int)uVar7,auVar14 & auVar16);
      uVar7 = (ulong)uVar8;
      if (uVar8 != 3) {
        pxVar2 = (pxVar3->_attribute)._attr;
        pxVar5[1]._node._root = (pxVar3->_node)._root;
        pxVar5[1]._attribute._attr = pxVar2;
        pxVar5 = pxVar5 + 1;
      }
    }
    pxVar5 = pxVar5 + 1;
  }
  this->_end = pxVar5;
  return;
}

Assistant:

void remove_duplicates(xpath_allocator* alloc)
		{
			if (_type == xpath_node_set::type_unsorted && _end - _begin > 2)
			{
				xpath_allocator_capture cr(alloc);

				size_t size_ = static_cast<size_t>(_end - _begin);

				size_t hash_size = 1;
				while (hash_size < size_ + size_ / 2) hash_size *= 2;

				const void** hash_data = static_cast<const void**>(alloc->allocate(hash_size * sizeof(void**)));
				if (!hash_data) return;

				memset(hash_data, 0, hash_size * sizeof(const void**));

				xpath_node* write = _begin;

				for (xpath_node* it = _begin; it != _end; ++it)
				{
					const void* attr = it->attribute().internal_object();
					const void* node = it->node().internal_object();
					const void* key = attr ? attr : node;

					if (key && hash_insert(hash_data, hash_size, key))
					{
						*write++ = *it;
					}
				}

				_end = write;
			}
			else
			{
				_end = unique(_begin, _end);
			}
		}